

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O0

void __thiscall
Imath_3_2::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  long lVar1;
  Plane3<float> *in_RDX;
  Frustum<float> *in_RSI;
  int iVar2;
  long in_RDI;
  Vec3<float> *pVVar3;
  float a;
  float b;
  float c;
  float a_00;
  float b_00;
  float c_00;
  float a_01;
  float b_01;
  float c_01;
  int index;
  int i;
  Plane3<float> frustumPlanes [6];
  float *local_e0;
  Vec3<float> local_d4;
  Vec3<float> local_c8;
  Vec3<float> local_bc;
  Vec3<float> local_b0;
  Vec3<float> local_a4;
  Vec3<float> local_98;
  Vec3<float> local_8c;
  int local_80;
  int local_7c;
  float local_78 [22];
  Matrix44<float> *in_stack_ffffffffffffffe0;
  
  local_e0 = local_78;
  do {
    Plane3<float>::Plane3((Plane3<float> *)0x169584);
    local_e0 = local_e0 + 4;
  } while (local_e0 != (float *)&stack0xffffffffffffffe8);
  Frustum<float>::planes(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    local_80 = local_7c * 3;
    lVar1 = (long)local_80;
    Vec3<float>::Vec3(&local_8c,local_78[lVar1 * 4],local_78[lVar1 * 4 + 4],local_78[lVar1 * 4 + 8])
    ;
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + (long)local_7c * 0xc),&local_8c);
    lVar1 = (long)local_80;
    Vec3<float>::Vec3(&local_98,local_78[lVar1 * 4 + 1],local_78[lVar1 * 4 + 5],
                      local_78[lVar1 * 4 + 9]);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x18 + (long)local_7c * 0xc),&local_98);
    lVar1 = (long)local_80;
    Vec3<float>::Vec3(&local_a4,local_78[lVar1 * 4 + 2],local_78[lVar1 * 4 + 6],
                      local_78[lVar1 * 4 + 10]);
    pVVar3 = (Vec3<float> *)(in_RDI + 0x30 + (long)local_7c * 0xc);
    Vec3<float>::operator=(pVVar3,&local_a4);
    iVar2 = (int)pVVar3;
    std::abs(iVar2);
    std::abs(iVar2);
    std::abs(iVar2);
    Vec3<float>::Vec3(&local_b0,a,b,c);
    pVVar3 = (Vec3<float> *)(in_RDI + 0x60 + (long)local_7c * 0xc);
    Vec3<float>::operator=(pVVar3,&local_b0);
    iVar2 = (int)pVVar3;
    std::abs(iVar2);
    std::abs(iVar2);
    std::abs(iVar2);
    Vec3<float>::Vec3(&local_bc,a_00,b_00,c_00);
    pVVar3 = (Vec3<float> *)(in_RDI + 0x78 + (long)local_7c * 0xc);
    Vec3<float>::operator=(pVVar3,&local_bc);
    iVar2 = (int)pVVar3;
    std::abs(iVar2);
    std::abs(iVar2);
    std::abs(iVar2);
    Vec3<float>::Vec3(&local_c8,a_01,b_01,c_01);
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x90 + (long)local_7c * 0xc),&local_c8);
    Vec3<float>::Vec3(&local_d4,local_78[(long)local_80 * 4 + 3],
                      local_78[(long)(local_80 + 1) * 4 + 3],local_78[(long)(local_80 + 2) * 4 + 3])
    ;
    Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x48 + (long)local_7c * 0xc),&local_d4);
  }
  Frustum<float>::operator=((Frustum<float> *)(in_RDI + 0xa8),in_RSI);
  Matrix44<float>::operator=((Matrix44<float> *)(in_RDI + 0xd0),(Matrix44<float> *)in_RDX);
  return;
}

Assistant:

void
FrustumTest<T>::setFrustum (
    const Frustum<T>& frustum, const Matrix44<T>& cameraMat) IMATH_NOEXCEPT
{
    Plane3<T> frustumPlanes[6];
    frustum.planes (frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.x,
            frustumPlanes[index + 1].normal.x,
            frustumPlanes[index + 2].normal.x);
        planeNormY[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.y,
            frustumPlanes[index + 1].normal.y,
            frustumPlanes[index + 2].normal.y);
        planeNormZ[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.z,
            frustumPlanes[index + 1].normal.z,
            frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i] = Vec3<T> (
            std::abs (planeNormX[i].x),
            std::abs (planeNormX[i].y),
            std::abs (planeNormX[i].z));
        planeNormAbsY[i] = Vec3<T> (
            std::abs (planeNormY[i].x),
            std::abs (planeNormY[i].y),
            std::abs (planeNormY[i].z));
        planeNormAbsZ[i] = Vec3<T> (
            std::abs (planeNormZ[i].x),
            std::abs (planeNormZ[i].y),
            std::abs (planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T> (
            frustumPlanes[index + 0].distance,
            frustumPlanes[index + 1].distance,
            frustumPlanes[index + 2].distance);
    }
    currFrustum  = frustum;
    cameraMatrix = cameraMat;
}